

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topic_manager.cpp
# Opt level: O2

void __thiscall miniros::TopicManager::getBusStats(TopicManager *this,XmlRpcValue *stats)

{
  __shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  XmlRpcValue *pXVar2;
  int iVar3;
  _List_node_base *p_Var4;
  __shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  PublicationPtr t;
  XmlRpcValue subscribe_stats;
  XmlRpcValue service_stats;
  XmlRpcValue publish_stats;
  
  publish_stats._type = TypeInvalid;
  publish_stats._value.asDouble = 0.0;
  subscribe_stats._type = TypeInvalid;
  subscribe_stats._value.asDouble = 0.0;
  service_stats._type = TypeInvalid;
  service_stats._value.asDouble = 0.0;
  XmlRpc::XmlRpcValue::assertArray
            (&publish_stats,
             (int)((ulong)((long)(this->advertised_topics_).
                                 super__Vector_base<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->advertised_topics_).
                                super__Vector_base<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4));
  XmlRpc::XmlRpcValue::assertArray
            (&subscribe_stats,
             (int)(this->subscriptions_).
                  super__List_base<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
                  ._M_impl._M_node._M_size);
  XmlRpc::XmlRpcValue::assertArray(&service_stats,0);
  std::recursive_mutex::lock(&this->advertised_topics_mutex_);
  p_Var1 = &((this->advertised_topics_).
             super__Vector_base<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>;
  iVar3 = 0;
  for (p_Var5 = &((this->advertised_topics_).
                  super__Vector_base<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>;
      p_Var5 != p_Var1; p_Var5 = p_Var5 + 1) {
    std::__shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&t.super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>,p_Var5);
    Publication::getStats((Publication *)&stack0xffffffffffffffc0);
    pXVar2 = XmlRpc::XmlRpcValue::operator[](&publish_stats,iVar3);
    XmlRpc::XmlRpcValue::operator=(pXVar2,(XmlRpcValue *)&stack0xffffffffffffffc0);
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)&stack0xffffffffffffffc0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&t.super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    iVar3 = iVar3 + 1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->advertised_topics_mutex_);
  std::mutex::lock(&this->subs_mutex_);
  iVar3 = 0;
  p_Var4 = (_List_node_base *)&this->subscriptions_;
  while (p_Var4 = (((_List_base<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
                     *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)&this->subscriptions_) {
    std::__shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2> *)&t,
               (__shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2> *)(p_Var4 + 1));
    Subscription::getStats((Subscription *)&stack0xffffffffffffffc0);
    pXVar2 = XmlRpc::XmlRpcValue::operator[](&subscribe_stats,iVar3);
    XmlRpc::XmlRpcValue::operator=(pXVar2,(XmlRpcValue *)&stack0xffffffffffffffc0);
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)&stack0xffffffffffffffc0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&t.super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    iVar3 = iVar3 + 1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  pXVar2 = XmlRpc::XmlRpcValue::operator[](stats,0);
  XmlRpc::XmlRpcValue::operator=(pXVar2,&publish_stats);
  pXVar2 = XmlRpc::XmlRpcValue::operator[](stats,1);
  XmlRpc::XmlRpcValue::operator=(pXVar2,&subscribe_stats);
  pXVar2 = XmlRpc::XmlRpcValue::operator[](stats,2);
  XmlRpc::XmlRpcValue::operator=(pXVar2,&service_stats);
  XmlRpc::XmlRpcValue::~XmlRpcValue(&service_stats);
  XmlRpc::XmlRpcValue::~XmlRpcValue(&subscribe_stats);
  XmlRpc::XmlRpcValue::~XmlRpcValue(&publish_stats);
  return;
}

Assistant:

void TopicManager::getBusStats(XmlRpcValue& stats)
{
  XmlRpcValue publish_stats, subscribe_stats, service_stats;
  // force these guys to be arrays, even if we don't populate them
  publish_stats.setSize(advertised_topics_.size());
  subscribe_stats.setSize(subscriptions_.size());
  service_stats.setSize(0);

  {
    uint32_t pidx = 0;
    std::scoped_lock<std::recursive_mutex> lock(advertised_topics_mutex_);
    for (PublicationPtr t: advertised_topics_)
      publish_stats[pidx++] = t->getStats();
  }

  {
    uint32_t sidx = 0;
    std::scoped_lock<std::mutex> lock(subs_mutex_);
    for (SubscriptionPtr t: subscriptions_)
      subscribe_stats[sidx++] = t->getStats();
  }

  stats[0] = publish_stats;
  stats[1] = subscribe_stats;
  stats[2] = service_stats;
}